

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddVarint
          (UnknownFieldLiteParserHelper *this,uint32_t num,uint64_t value)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  
  if (this->unknown_ == (string *)0x0) {
    return;
  }
  uVar3 = (ulong)(num << 3);
  cVar2 = (char)this->unknown_;
  if (0x7f < num << 3) {
    do {
      std::__cxx11::string::push_back(cVar2);
      bVar1 = 0x3fff < uVar3;
      uVar3 = uVar3 >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar2);
  cVar2 = (char)this->unknown_;
  if (0x7f < value) {
    do {
      std::__cxx11::string::push_back(cVar2);
      bVar1 = 0x3fff < value;
      value = value >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar2);
  return;
}

Assistant:

void AddVarint(uint32_t num, uint64_t value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8, unknown_);
    WriteVarint(value, unknown_);
  }